

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardingTimeCoordinator.cpp
# Opt level: O3

string * __thiscall
helics::ForwardingTimeCoordinator::printTimeStatus_abi_cxx11_
          (string *__return_storage_ptr__,ForwardingTimeCoordinator *this)

{
  long lVar1;
  long lVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view fmt;
  format_args args;
  double local_38 [2];
  double local_28;
  double local_18;
  
  lVar1 = (this->downstream).super_TimeData.next.internalTimeCode;
  lVar2 = (this->downstream).super_TimeData.Te.internalTimeCode;
  local_38[0] = (double)(lVar1 % 1000000000) * 1e-09 + (double)(lVar1 / 1000000000);
  local_28 = (double)(lVar2 % 1000000000) * 1e-09 + (double)(lVar2 / 1000000000);
  lVar1 = (this->downstream).super_TimeData.minDe.internalTimeCode;
  local_18 = (double)(lVar1 % 1000000000) * 1e-09 + (double)(lVar1 / 1000000000);
  fmt.size_ = 0xaaa;
  fmt.data_ = (char *)0x27;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)local_38;
  ::fmt::v11::vformat_abi_cxx11_
            (__return_storage_ptr__,(v11 *)"{{\"time_next\":{}, \"Te\":{}, \"minDe\":{}}}",fmt,args)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string ForwardingTimeCoordinator::printTimeStatus() const
{
    return fmt::format(R"raw({{"time_next":{}, "Te":{}, "minDe":{}}})raw",
                       static_cast<double>(downstream.next),
                       static_cast<double>(downstream.Te),
                       static_cast<double>(downstream.minDe));
}